

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O1

err_t cmdFileSuffixRead(octet *suffix,size_t *count,char *name,size_t offset)

{
  bool bVar1;
  bool_t bVar2;
  file_t file;
  size_t sVar3;
  octet *der;
  size_t sVar4;
  size_t sVar5;
  err_t eVar6;
  err_t eVar7;
  ulong uVar8;
  size_t len;
  u32 tag;
  size_t local_40;
  u32 local_34;
  
  file = fileOpen(name,"rb");
  if (file == (file_t)0x0) {
    return 0xcb;
  }
  sVar3 = fileSize(file);
  uVar8 = sVar3 - offset;
  if (sVar3 == 0xffffffffffffffff || (sVar3 < offset || uVar8 == 0)) {
    eVar6 = 0xd1;
    if (offset < sVar3) {
      eVar6 = 0;
    }
    eVar7 = 0xcf;
    if (sVar3 != 0xffffffffffffffff) {
      eVar7 = eVar6;
    }
    goto LAB_00104b78;
  }
  der = (octet *)blobCreate(0x10);
  if (der == (octet *)0x0) goto LAB_00104b82;
  sVar5 = 0x10;
  if (uVar8 < 0x10) {
    sVar5 = uVar8;
  }
  eVar7 = 0;
  bVar2 = fileSeek(file,uVar8 - sVar5,0);
  if (bVar2 == 0) {
LAB_00104a08:
    eVar7 = 0xcf;
    bVar1 = false;
  }
  else {
    sVar4 = fileRead2(der,sVar5,file);
    bVar1 = true;
    if (sVar4 != sVar5) goto LAB_00104a08;
  }
  if (bVar1) {
    memRev(der,sVar5);
    sVar5 = derTLDec(&local_34,&local_40,der,sVar5);
    if ((sVar5 == 0xffffffffffffffff) || (sVar3 < offset + sVar5 + local_40)) {
      eVar7 = 0x132;
      bVar1 = false;
    }
    else {
      eVar7 = 0;
      bVar1 = true;
    }
    if (bVar1) {
      sVar5 = sVar5 + local_40;
      blobClose(der);
      der = (octet *)blobCreate(sVar5);
      if (der == (octet *)0x0) {
LAB_00104b82:
        fileClose(file);
        return 0x6e;
      }
      eVar7 = 0;
      bVar2 = fileSeek(file,uVar8 - sVar5,0);
      if (bVar2 == 0) {
LAB_00104aeb:
        eVar7 = 0xcf;
        bVar1 = false;
      }
      else {
        sVar3 = fileRead2(der,sVar5,file);
        bVar1 = true;
        if (sVar3 != sVar5) goto LAB_00104aeb;
      }
      if (bVar1) {
        bVar2 = fileClose(file);
        if (bVar2 == 0) {
          blobClose(der);
          return 0x67;
        }
        memRev(der,sVar5);
        bVar2 = derIsValid3(der,sVar5);
        if (bVar2 != 0) {
          memRev(der,sVar5);
          eVar6 = 0;
          if ((suffix != (octet *)0x0) && (eVar6 = 0x6e, sVar5 <= *count)) {
            memCopy(suffix,der,sVar5);
            eVar6 = 0;
          }
          *count = sVar5;
          blobClose(der);
          return eVar6;
        }
        blobClose(der);
        return 0x132;
      }
    }
  }
  blobClose(der);
LAB_00104b78:
  fileClose(file);
  return eVar7;
}

Assistant:

err_t cmdFileSuffixRead(octet* suffix, size_t* count, const char* name,
	size_t offset)
{
	const size_t buf_size = 16;
	err_t code;
	file_t file;
	size_t size;
	void* buf;
	size_t c;
	u32 tag;
	size_t len;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(count, O_PER_S));
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (offset >= size)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// прочитать заголовок суффикса
	c = MIN2(buf_size, size - offset);
	if (!fileSeek(file, size - offset - c, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// развернуть суффикс
	memRev(buf, c);
	// определить длину суффикса
	c = derTLDec(&tag, &len, buf, c);
	if (c == SIZE_MAX || offset + c + len > size)
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	c += len;
	// прочитать суффикс
	cmdBlobClose(buf);
	code = cmdBlobCreate(buf, c);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	if (!fileSeek(file, size - offset - c, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// проверить суффикс
	memRev(buf, c);
	if (!derIsValid3(buf, c))
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	memRev(buf, c);
	// возвратить суффикс и его длину
	if (suffix)
	{
		ASSERT(memIsValid(suffix, *count));
		if (*count < c)
			code = ERR_OUTOFMEMORY;
		else
			memCopy(suffix, buf, c);
	}
	*count = c;
	// завершить
	cmdBlobClose(buf);
	return code;
}